

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O0

void __thiscall
polyscope::TransformationGizmo::TransformationGizmo
          (TransformationGizmo *this,string *name_,mat4 *T_,
          PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *Tpers_)

{
  Widget *pWVar1;
  PersistentValue<bool> *in_RCX;
  _func_int **in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Widget *in_RDI;
  WeakReferrable *in_stack_ffffffffffffff90;
  char *this_00;
  allocator local_51;
  string local_50 [39];
  undefined1 in_stack_ffffffffffffffd7;
  string *in_stack_ffffffffffffffd8;
  
  WeakReferrable::WeakReferrable(in_stack_ffffffffffffff90);
  Widget::Widget(in_RDI,(void **)in_RSI);
  in_RDI->_vptr_Widget = (_func_int **)0x98c658;
  *(undefined8 *)&in_RDI[6].field_0x10 = 0x98c698;
  this_00 = &in_RDI->field_0x8;
  std::__cxx11::string::string((string *)this_00,(string *)in_RSI);
  std::operator+(in_RSI,this_00);
  PersistentValue<bool>::PersistentValue
            (in_RCX,in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
  std::__cxx11::string::~string(local_50);
  in_RDI[2]._vptr_Widget = in_RDX;
  *(PersistentValue<bool> **)&in_RDI[2].field_0x8 = in_RCX;
  *(undefined4 *)&in_RDI[2].field_0x10 = 0x3da3d70a;
  *(undefined4 *)&in_RDI[2].field_0x14 = 0x3dcccccd;
  *(undefined4 *)&in_RDI[2].field_0x18 = 0x3fc00000;
  *(undefined4 *)&in_RDI[2].field_0x1c = 0x3ea3d70a;
  pWVar1 = in_RDI + 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&pWVar1->field_0x20,"wax",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  *(undefined4 *)&in_RDI[3].field_0x18 = 0xffffffff;
  *(undefined4 *)&in_RDI[3].field_0x1c = 0;
  in_RDI[3].field_0x20 = 0;
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&in_RDI[3].field_0x24,1.0,0.0,0.0);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&in_RDI[4].field_0x8,0.8274509803921568,
             0.17647058823529413,0.24313725490196078);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&in_RDI[4].field_0x14,0.2549019607843137,
             0.4745098039215686,0.8823529411764706);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&in_RDI[4].field_0x20,0.37254901960784315,
             0.6862745098039216,0.13725490196078433);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x456663);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x456674);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x456685);
  return;
}

Assistant:

TransformationGizmo::TransformationGizmo(std::string name_, glm::mat4& T_, PersistentValue<glm::mat4>* Tpers_)
    : name(name_), enabled(name + "#name", false), T(T_), Tpers(Tpers_)

{}